

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O3

void __thiscall VpulibDlsym::VpulibDlsym(VpulibDlsym *this)

{
  undefined8 uVar1;
  void *pvVar2;
  _func_RK_S32_VpuCodecContext_ptr_ptr *p_Var3;
  long lVar4;
  
  this->rkapi_hdl = (void *)0x0;
  this->rkvpu_open_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  this->rkvpu_close_cxt = (_func_RK_S32_VpuCodecContext_ptr_ptr *)0x0;
  lVar4 = 0;
  do {
    uVar1 = *(undefined8 *)((long)codec_paths + lVar4);
    pvVar2 = (void *)dlopen(uVar1,0x101);
    this->rkapi_hdl = pvVar2;
    if (pvVar2 != (void *)0x0) {
      p_Var3 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(pvVar2,"vpu_open_context");
      this->rkvpu_open_cxt = p_Var3;
      p_Var3 = (_func_RK_S32_VpuCodecContext_ptr_ptr *)dlsym(this->rkapi_hdl,"vpu_close_context");
      this->rkvpu_close_cxt = p_Var3;
      _mpp_log_l(4,"vpu_api","dlopen vpu lib %s success\n",0,uVar1);
      return;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20);
  return;
}

Assistant:

VpulibDlsym() :
        rkapi_hdl(NULL),
        rkvpu_open_cxt(NULL),
        rkvpu_close_cxt(NULL) {
        RK_U32 i;

        for (i = 0; i < MPP_ARRAY_ELEMS(codec_paths); i++) {
            rkapi_hdl = dlopen(codec_paths[i], RTLD_LAZY | RTLD_GLOBAL);
            if (rkapi_hdl)
                break;
        }

        if (rkapi_hdl) {
            rkvpu_open_cxt  = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_open_context");
            rkvpu_close_cxt = (RK_S32 (*)(VpuCodecContext **ctx))
                              dlsym(rkapi_hdl, "vpu_close_context");
            mpp_log("dlopen vpu lib %s success\n", codec_paths[i]);
        }
    }